

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.c
# Opt level: O2

void curl_slist_free_all(curl_slist *list)

{
  curl_slist *pcVar1;
  
  if (list != (curl_slist *)0x0) {
    do {
      pcVar1 = list->next;
      (*Curl_cfree)(list->data);
      list->data = (char *)0x0;
      (*Curl_cfree)(list);
      list = pcVar1;
    } while (pcVar1 != (curl_slist *)0x0);
  }
  return;
}

Assistant:

void curl_slist_free_all(struct curl_slist *list)
{
  struct curl_slist     *next;
  struct curl_slist     *item;

  if(!list)
    return;

  item = list;
  do {
    next = item->next;
    Curl_safefree(item->data);
    free(item);
    item = next;
  } while(next);
}